

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,bool qualified)

{
  Descriptor *pDVar1;
  string *psVar2;
  string local_e8;
  undefined4 local_c4;
  string local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string inner_name;
  string *outer_name;
  Descriptor *outer;
  bool qualified_local;
  Descriptor *descriptor_local;
  
  outer_name = (string *)this;
  while( true ) {
    pDVar1 = Descriptor::containing_type((Descriptor *)outer_name);
    if (pDVar1 == (Descriptor *)0x0) break;
    outer_name = (string *)Descriptor::containing_type((Descriptor *)outer_name);
  }
  inner_name.field_2._8_8_ = Descriptor::full_name_abi_cxx11_((Descriptor *)outer_name);
  psVar2 = Descriptor::full_name_abi_cxx11_((Descriptor *)this);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_50,(ulong)psVar2);
  if (((ulong)descriptor & 1) == 0) {
    psVar2 = Descriptor::name_abi_cxx11_((Descriptor *)outer_name);
    anon_unknown_0::DotsToUnderscores(&local_e8,(string *)local_50);
    std::operator+(__return_storage_ptr__,psVar2,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  else {
    anon_unknown_0::DotsToColons(&local_90,(string *)inner_name.field_2._8_8_);
    std::operator+(&local_70,"::",&local_90);
    anon_unknown_0::DotsToUnderscores(&local_c0,(string *)local_50);
    std::operator+(__return_storage_ptr__,&local_70,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  local_c4 = 1;
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Descriptor* descriptor, bool qualified) {

  // Find "outer", the descriptor of the top-level message in which
  // "descriptor" is embedded.
  const Descriptor* outer = descriptor;
  while (outer->containing_type() != NULL) outer = outer->containing_type();

  const string& outer_name = outer->full_name();
  string inner_name = descriptor->full_name().substr(outer_name.size());

  if (qualified) {
    return "::" + DotsToColons(outer_name) + DotsToUnderscores(inner_name);
  } else {
    return outer->name() + DotsToUnderscores(inner_name);
  }
}